

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::anon_unknown_0::ComputeCacheTest::initPrograms
          (ComputeCacheTest *this,SourceCollections *programCollection)

{
  ProgramSources *this_00;
  allocator<char> local_99;
  string local_98;
  ShaderSource local_78;
  allocator<char> local_39;
  string local_38;
  SourceCollections *local_18;
  SourceCollections *programCollection_local;
  ComputeCacheTest *this_local;
  
  local_18 = programCollection;
  programCollection_local = (SourceCollections *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"basic_compute",&local_39);
  this_00 = ::vk::ProgramCollection<glu::ProgramSources>::add
                      (&programCollection->glslSources,&local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,
             "#version 310 es\nlayout(local_size_x = 1) in;\nlayout(std430) buffer;\nlayout(binding = 0) readonly buffer Input0\n{\n  vec4 elements[];\n} input_data0;\nlayout(binding = 1) writeonly buffer Output\n{\n  vec4 elements[];\n} output_data;\nvoid main()\n{\n  uint ident = gl_GlobalInvocationID.x;\n  output_data.elements[ident] = input_data0.elements[ident] * input_data0.elements[ident];\n}"
             ,&local_99);
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_78,&local_98);
  glu::ProgramSources::operator<<(this_00,&local_78);
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void ComputeCacheTest::initPrograms (SourceCollections& programCollection) const
{
	programCollection.glslSources.add("basic_compute") << glu::ComputeSource(
		"#version 310 es\n"
		"layout(local_size_x = 1) in;\n"
		"layout(std430) buffer;\n"
		"layout(binding = 0) readonly buffer Input0\n"
		"{\n"
		"  vec4 elements[];\n"
		"} input_data0;\n"
		"layout(binding = 1) writeonly buffer Output\n"
		"{\n"
		"  vec4 elements[];\n"
		"} output_data;\n"
		"void main()\n"
		"{\n"
		"  uint ident = gl_GlobalInvocationID.x;\n"
		"  output_data.elements[ident] = input_data0.elements[ident] * input_data0.elements[ident];\n"
		"}");
}